

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseProtocol.cpp
# Opt level: O0

bool tonk::protocol::DatagramIsTruncated(uint8_t *data,size_t bytes)

{
  int iVar1;
  ulong in_RSI;
  long in_RDI;
  FlagsReader flags;
  uint8_t *footer;
  FlagsReader local_49;
  uint8_t *local_48;
  ulong local_40;
  bool local_29;
  
  if (in_RSI < 3) {
    local_29 = true;
  }
  else {
    local_48 = (uint8_t *)(in_RDI + in_RSI + -3);
    local_40 = in_RSI;
    FlagsReader::FlagsReader(&local_49,*local_48);
    if ((local_49.FlagsByte & 0x80) != 0) {
      iVar1 = 0;
      if ((local_49.FlagsByte & 0x40) != 0) {
        iVar1 = 0xc;
      }
      if (local_40 < iVar1 + 6 + ((local_49.FlagsByte & 0xc) >> 2) + (local_49.FlagsByte & 3)) {
        return true;
      }
    }
    local_29 = false;
  }
  return local_29;
}

Assistant:

bool DatagramIsTruncated(const uint8_t* data, size_t bytes)
{
    // If datagram is too short for any valid content:
    if (bytes < kEncryptionTagBytes + kFlagsBytes) {
        return true;
    }

    // Read flags byte
    const uint8_t* footer = data + bytes - kFlagsBytes - kEncryptionTagBytes;
    const FlagsReader flags = footer[0];

    // If the datagram is not large enough to contain the footer:
    if (flags.IsConnectionDatagram() &&
        bytes < flags.ConnectedFooterBytes())
    {
        // This is truncated
        return true;
    }

    // Datagram is large enough to contain valid data
    return false;
}